

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TldCountTest.cpp
# Opt level: O2

bool __thiscall TldCountTest::DoTest(TldCountTest *this)

{
  undefined8 uVar1;
  __normal_iterator<TldAsKey_**,_std::vector<TldAsKey_*,_std::allocator<TldAsKey_*>_>_> __last;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  size_t i_1;
  size_t sVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  TldAsKey *pTVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  DnsHashEntry *pDVar16;
  __normal_iterator<TldAsKey_**,_std::vector<TldAsKey_*,_std::allocator<TldAsKey_*>_>_> __first;
  ulong uVar17;
  char *pcVar18;
  size_t i_5;
  uint32_t i_3;
  int i_2;
  uint32_t uVar19;
  long lVar20;
  uint8_t *tld;
  ulong uVar21;
  bool stored;
  ulong local_3238;
  uint local_322c;
  BinHash<DnsHashEntry> hashTable;
  tld_error_report_t i_r;
  char rand_name [17];
  vector<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_> final_report;
  vector<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_> extract_report;
  vector<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_> insert_report;
  LruHash<TldAsKey> tldStringUsage;
  DnsHashEntry key;
  DnsHashEntry counter_entry;
  uint64_t count_per_string [1543];
  
  tldStringUsage.binHash.tableSize = 0;
  tldStringUsage.binHash.tableCount = 0;
  tldStringUsage.binHash.hashBin = (TldAsKey **)0x0;
  tldStringUsage.MostRecentlyUsed = (TldAsKey *)0x0;
  tldStringUsage.LeastRecentlyUsed = (TldAsKey *)0x0;
  tldStringUsage.targetSize = 0;
  hashTable.tableSize = 0;
  hashTable.tableCount = 0;
  hashTable.hashBin = (DnsHashEntry **)0x0;
  insert_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  insert_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  insert_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extract_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extract_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extract_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  final_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  final_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  final_report.super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar13 = 0x14; lVar13 != 0x4f4; lVar13 = lVar13 + 0x18) {
    DnsHashEntry::DnsHashEntry(&key);
    counter_entry.HashNext._0_1_ = 0;
    key.count = (uint64_t)*(int *)((long)&hash_input_table[0].registry_id + lVar13);
    key.registry_id = *(uint32_t *)((long)&PTR_typeinfo_name_001e44e8 + lVar13 + 4);
    if (*(int *)((long)&PTR_typeinfo_001e44f0 + lVar13) == 0) {
      key.key_type = 0;
      key.key_length = 4;
      key.field_6.key_number = *(undefined4 *)(&UNK_001e44fc + lVar13);
    }
    else {
      pcVar18 = *(char **)((long)&PTR_typeinfo_001e44f0 + lVar13 + 4);
      sVar6 = strlen(pcVar18);
      key.key_length = (uint32_t)sVar6;
      key.key_type = 1;
      memcpy(&key.field_6,pcVar18,sVar6 & 0xffffffff);
      key.field_6.key_value[sVar6 & 0xffffffff] = '\0';
    }
    BinHash<DnsHashEntry>::InsertOrAdd(&hashTable,&key,true,(bool *)&counter_entry);
    DnsHashEntry::~DnsHashEntry(&key);
  }
  uVar7 = 0x10000;
  lVar13 = 0;
  lVar20 = 0;
  for (uVar11 = 1; uVar11 != 0x607; uVar11 = uVar11 + 1) {
    lVar20 = lVar20 + uVar7;
    uVar21 = 0;
    if (uVar11 < 0x81) {
      uVar21 = uVar7;
    }
    lVar13 = lVar13 + uVar21;
    count_per_string[uVar11] = uVar7;
    uVar7 = uVar7 >> (1 < uVar7);
  }
  count_per_string[0] = lVar20 * 3;
  uVar11 = lVar20 * 4;
  pvVar8 = operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | lVar20 << 5);
  uVar7 = 0;
  for (lVar9 = 0; lVar9 != 0x607; lVar9 = lVar9 + 1) {
    uVar21 = count_per_string[lVar9];
    for (uVar15 = 0; (uVar15 < uVar21 && (uVar7 + uVar15 < uVar11)); uVar15 = uVar15 + 1) {
      *(long *)((long)pvVar8 + uVar15 * 8 + uVar7 * 8) = lVar9;
    }
    uVar7 = uVar7 + uVar15;
  }
  uVar19 = (int)lVar20 << 2;
  uVar7 = uVar11;
  while (uVar7 = uVar7 - 1, uVar7 != 0) {
    uVar3 = random_uniform(uVar19);
    uVar21 = (ulong)uVar3;
    if (uVar7 != uVar21) {
      uVar1 = *(undefined8 *)((long)pvVar8 + uVar21 * 8);
      *(undefined8 *)((long)pvVar8 + uVar21 * 8) = *(undefined8 *)((long)pvVar8 + uVar7 * 8);
      *(undefined8 *)((long)pvVar8 + uVar7 * 8) = uVar1;
    }
    uVar19 = uVar19 - 1;
  }
  local_3238 = 0;
  for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
    stored = false;
    lVar20 = *(long *)((long)pvVar8 + uVar7 * 8);
    if (lVar20 == 0) {
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
        uVar19 = random_uniform(0x1a);
        rand_name[lVar9] = (char)uVar19 + 'A';
      }
      rand_name[0x10] = '\0';
      tld = (uint8_t *)rand_name;
    }
    else {
      tld = *(uint8_t **)(&DAT_001e14a8 + lVar20 * 8);
    }
    sVar6 = strlen((char *)tld);
    TldAsKey::TldAsKey((TldAsKey *)&key,tld,sVar6);
    DnsHashEntry::DnsHashEntry(&counter_entry);
    counter_entry.registry_id = 0x27;
    counter_entry.key_type = 0;
    counter_entry.key_length = 4;
    counter_entry.field_6.key_number = 0;
    counter_entry.count = 1;
    BinHash<DnsHashEntry>::InsertOrAdd(&hashTable,&counter_entry,true,&stored);
    if ((0x7fff < tldStringUsage.binHash.tableCount) &&
       (pTVar10 = LruHash<TldAsKey>::RemoveLRU(&tldStringUsage), pTVar10 != (TldAsKey *)0x0)) {
      local_3238 = local_3238 + pTVar10->count;
      TldAsKey::~TldAsKey(pTVar10);
      operator_delete(pTVar10);
    }
    pTVar10 = LruHash<TldAsKey>::InsertOrAdd(&tldStringUsage,(TldAsKey *)&key,true,&stored);
    if ((pTVar10 != (TldAsKey *)0x0) && (lVar20 != 0)) {
      if (count_per_string[lVar20] < (ulong)pTVar10->count) {
        i_r.tld = *(char **)(&DAT_001e14a8 + lVar20 * 8);
        i_r.rank = 0;
        i_r.expected_count = (int)count_per_string[lVar20];
        i_r.actual_count = pTVar10->count;
        std::vector<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>::push_back
                  (&insert_report,&i_r);
      }
    }
    DnsHashEntry::~DnsHashEntry(&counter_entry);
    TldAsKey::~TldAsKey((TldAsKey *)&key);
  }
  if ((ulong)tldStringUsage.binHash._0_8_ >> 0x20 == 0) {
    uVar21 = 0;
    bVar14 = true;
    uVar7 = local_3238;
  }
  else {
    pDVar16 = &counter_entry;
    std::vector<TldAsKey_*,_std::allocator<TldAsKey_*>_>::vector
              ((vector<TldAsKey_*,_std::allocator<TldAsKey_*>_> *)pDVar16,
               (ulong)tldStringUsage.binHash._0_8_ >> 0x20,(allocator_type *)&key);
    bVar14 = true;
    lVar20 = 0;
    for (uVar7 = 0; uVar7 < (tldStringUsage.binHash._0_8_ & 0xffffffff); uVar7 = uVar7 + 1) {
      pTVar10 = (TldAsKey *)(tldStringUsage.binHash.hashBin + uVar7);
      lVar20 = (long)(int)lVar20;
      while (pTVar10 = pTVar10->HashNext, pTVar10 != (TldAsKey *)0x0) {
        uVar4 = GetTldIndex((TldCountTest *)pDVar16,pTVar10->tld,pTVar10->tld_len);
        if (uVar4 < 0x80) {
          uVar21 = count_per_string[(ulong)uVar4 + 1];
          if (uVar21 != pTVar10->count) {
            key.HashNext = (DnsHashEntry *)TargetNames[uVar4];
            key.hash = 0;
            key.count = CONCAT44(key.count._4_4_,pTVar10->count);
            key.registry_id = (uint32_t)uVar21;
            pDVar16 = (DnsHashEntry *)&extract_report;
            std::vector<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>::push_back
                      ((vector<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_> *)
                       pDVar16,(value_type *)&key);
            if (uVar21 < pTVar10->count) {
              bVar14 = false;
            }
          }
        }
        *(TldAsKey **)
         (CONCAT71(counter_entry.HashNext._1_7_,counter_entry.HashNext._0_1_) + lVar20 * 8) =
             pTVar10;
        lVar20 = lVar20 + 1;
      }
    }
    __first._M_current._1_7_ = counter_entry.HashNext._1_7_;
    __first._M_current._0_1_ = counter_entry.HashNext._0_1_;
    __last._M_current._4_4_ = counter_entry.registry_id;
    __last._M_current._0_4_ = counter_entry.hash;
    std::
    __sort<__gnu_cxx::__normal_iterator<TldAsKey**,std::vector<TldAsKey*,std::allocator<TldAsKey*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(TldAsKey*,TldAsKey*)>>
              (__first,__last,(_Iter_comp_iter<bool_(*)(TldAsKey_*,_TldAsKey_*)>)0x19316a);
    uVar21 = 0;
    local_322c = 0;
    uVar7 = local_3238;
    for (uVar15 = 0;
        uVar15 < (ulong)(CONCAT44(counter_entry.registry_id,counter_entry.hash) -
                         CONCAT71(counter_entry.HashNext._1_7_,counter_entry.HashNext._0_1_) >> 3);
        uVar15 = uVar15 + 1) {
      lVar20 = *(long *)(CONCAT71(counter_entry.HashNext._1_7_,counter_entry.HashNext._0_1_) +
                        uVar15 * 8);
      uVar4 = *(uint *)(lVar20 + 0x68);
      if (local_322c < 0x80) {
        local_3238 = uVar7;
        uVar5 = GetTldIndex((TldCountTest *)__first._M_current,(uint8_t *)(lVar20 + 0x20),
                            *(size_t *)(lVar20 + 0x18));
        DnsHashEntry::DnsHashEntry(&key);
        rand_name[0] = '\0';
        lVar9 = CONCAT71(counter_entry.HashNext._1_7_,counter_entry.HashNext._0_1_);
        lVar20 = *(long *)(lVar9 + uVar15 * 8);
        key.count = (uint64_t)*(uint *)(lVar20 + 0x68);
        key.registry_id = 0x26;
        key.key_length = (uint32_t)*(size_t *)(lVar20 + 0x18);
        key.key_type = 1;
        memcpy(&key.field_6,(void *)(lVar20 + 0x20),*(size_t *)(lVar20 + 0x18));
        key.field_6.key_value[*(long *)(*(long *)(lVar9 + uVar15 * 8) + 0x18)] = '\0';
        BinHash<DnsHashEntry>::InsertOrAdd(&hashTable,&key,true,(bool *)rand_name);
        uVar7 = local_3238;
        i_r.tld = "???";
        i_r.rank = (int)uVar15;
        i_r.actual_count =
             *(uint *)(*(long *)(CONCAT71(counter_entry.HashNext._1_7_,counter_entry.HashNext._0_1_)
                                + uVar15 * 8) + 0x68);
        i_r.expected_count = 0;
        if ((int)uVar5 < 0) {
          bVar2 = bVar14;
          if (1 < (uint)i_r.actual_count) goto LAB_00181ffe;
        }
        else {
          i_r.tld = TargetNames[uVar5];
          uVar17 = count_per_string[(ulong)uVar5 + 1];
          i_r.expected_count = (int)uVar17;
          uVar12 = (ulong)*(uint *)(*(long *)(CONCAT71(counter_entry.HashNext._1_7_,
                                                       counter_entry.HashNext._0_1_) + uVar15 * 8) +
                                   0x68);
          if (uVar17 != uVar12) {
            bVar2 = false;
            if (uVar12 <= uVar17) {
              bVar2 = bVar14;
            }
LAB_00181ffe:
            std::vector<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>::push_back
                      (&final_report,&i_r);
            bVar14 = bVar2;
          }
        }
        uVar21 = uVar21 + uVar4;
        local_322c = local_322c + 1;
        __first._M_current = (TldAsKey **)&key;
        DnsHashEntry::~DnsHashEntry(&key);
      }
      else {
        uVar7 = uVar7 + uVar4;
      }
    }
    std::_Vector_base<TldAsKey_*,_std::allocator<TldAsKey_*>_>::~_Vector_base
              ((_Vector_base<TldAsKey_*,_std::allocator<TldAsKey_*>_> *)&counter_entry);
  }
  if ((uVar7 + uVar21 == uVar11) && (bVar14)) {
    if ((lVar13 - uVar21) + 0x80 < 0x101) {
      uVar7 = 0;
      uVar15 = 0;
      for (uVar17 = 0; uVar17 != (hashTable._0_8_ & 0xffffffff); uVar17 = uVar17 + 1) {
        pDVar16 = (DnsHashEntry *)(hashTable.hashBin + uVar17);
        while (pDVar16 = pDVar16->HashNext, pDVar16 != (DnsHashEntry *)0x0) {
          if (pDVar16->registry_id == 0x27) {
            uVar7 = pDVar16->count;
          }
          else if (pDVar16->registry_id == 0x26) {
            uVar15 = uVar15 + pDVar16->count;
          }
        }
      }
      if (uVar15 == uVar21) {
        bVar14 = true;
        if (uVar7 == uVar11) goto LAB_0018211d;
        pcVar18 = "Tld total from hash: %d  != total_keys: %d\n";
        uVar15 = uVar7;
        uVar21 = uVar11;
      }
      else {
        pcVar18 = "Tld sum count after hash: %d  != kept_keys: %d\n";
      }
      bVar14 = false;
      TEST_LOG(pcVar18,uVar15,uVar21);
    }
    else {
      bVar14 = false;
      TEST_LOG("Tld count test, expected_count: %d >> kept_keys: %d\n",lVar13,uVar21 & 0xffffffff);
    }
  }
  else {
    bVar14 = false;
    TEST_LOG("Tld count test, kept_keys + dropped_keys: %d + %d = %d != total: %d\n",
             uVar21 & 0xffffffff,uVar7 & 0xffffffff,(ulong)(uint)((int)uVar7 + (int)uVar21),
             uVar11 & 0xffffffff);
  }
LAB_0018211d:
  operator_delete__(pvVar8);
  if (bVar14 == false) {
    lVar13 = 0x10;
    for (uVar11 = 0;
        uVar11 < (ulong)(((long)insert_report.
                                super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)insert_report.
                               super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar11 = uVar11 + 1) {
      TEST_LOG("TLD %s, inserted count %d instead of %d\n",
               *(undefined8 *)
                ((long)insert_report.
                       super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x10),
               (ulong)*(uint *)((long)&(insert_report.
                                        super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->tld + lVar13),
               (ulong)*(uint *)((long)insert_report.
                                      super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -4));
      lVar13 = lVar13 + 0x18;
    }
    lVar13 = 0x10;
    for (uVar11 = 0;
        uVar11 < (ulong)(((long)extract_report.
                                super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)extract_report.
                               super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar11 = uVar11 + 1) {
      TEST_LOG("TLD %s, extracted count %d instead of %d\n",
               *(undefined8 *)
                ((long)extract_report.
                       super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x10),
               (ulong)*(uint *)((long)&(extract_report.
                                        super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->tld + lVar13),
               (ulong)*(uint *)((long)extract_report.
                                      super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -4));
      lVar13 = lVar13 + 0x18;
    }
    lVar13 = 0x10;
    for (uVar11 = 0;
        uVar11 < (ulong)(((long)final_report.
                                super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)final_report.
                               super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar11 = uVar11 + 1) {
      TEST_LOG("Rank %d, %s, final count %d instead of %d\n",
               (ulong)*(uint *)((long)final_report.
                                      super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8),
               *(undefined8 *)
                ((long)final_report.
                       super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x10),
               (ulong)*(uint *)((long)&(final_report.
                                        super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->tld + lVar13),
               (ulong)*(uint *)((long)final_report.
                                      super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -4));
      lVar13 = lVar13 + 0x18;
    }
  }
  std::_Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>::~_Vector_base
            (&final_report.
              super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>);
  std::_Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>::~_Vector_base
            (&extract_report.
              super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>);
  std::_Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>::~_Vector_base
            (&insert_report.
              super__Vector_base<st_tld_error_report_t,_std::allocator<st_tld_error_report_t>_>);
  BinHash<DnsHashEntry>::Clear(&hashTable);
  LruHash<TldAsKey>::~LruHash(&tldStringUsage);
  return bVar14;
}

Assistant:

TldCountTest::~TldCountTest()
{
}